

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Function_BlockSpecializationsEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse>
          (Arena *arena)

{
  Function_BlockSpecializationsEntry_DoNotUse *this;
  
  if (arena == (Arena *)0x0) {
    this = (Function_BlockSpecializationsEntry_DoNotUse *)operator_new(0x28);
    CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse::
    Function_BlockSpecializationsEntry_DoNotUse(this,(Arena *)0x0);
  }
  else {
    this = (Function_BlockSpecializationsEntry_DoNotUse *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse::
                       typeinfo);
    CoreML::Specification::MILSpec::Function_BlockSpecializationsEntry_DoNotUse::
    Function_BlockSpecializationsEntry_DoNotUse(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }